

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O0

void __thiscall CSounds::Enqueue(CSounds *this,int Channel,int SetId)

{
  int iVar1;
  CConfig *pCVar2;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  
  if ((((*(byte *)(*(long *)(in_RDI + 8) + 0xd24) & 1) == 0) && (*(int *)(in_RDI + 0x110) < 0x20))
     && ((in_ESI == 1 ||
         (pCVar2 = CComponent::Config((CComponent *)0x1c29cc), pCVar2->m_ClEditor == 0)))) {
    *(int *)(in_RDI + 0x10 + (long)*(int *)(in_RDI + 0x110) * 8) = in_ESI;
    iVar1 = *(int *)(in_RDI + 0x110);
    *(int *)(in_RDI + 0x110) = iVar1 + 1;
    *(undefined4 *)(in_RDI + 0x14 + (long)iVar1 * 8) = in_EDX;
  }
  return;
}

Assistant:

void CSounds::Enqueue(int Channel, int SetId)
{
	if(m_pClient->m_SuppressEvents)
		return;
	if(m_QueuePos >= QUEUE_SIZE)
		return;
	if(Channel != CHN_MUSIC && Config()->m_ClEditor)
		return;

	m_aQueue[m_QueuePos].m_Channel = Channel;
	m_aQueue[m_QueuePos++].m_SetId = SetId;
}